

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dekker.cpp
# Opt level: O2

void thread_fun_naive(int *self_lock,int *other_lock,int num,int *gp)

{
  int iVar1;
  
  iVar1 = 0;
  if (num < 1) {
    num = 0;
    iVar1 = 0;
  }
  for (; iVar1 != num; iVar1 = iVar1 + 1) {
    while (*self_lock = 1, *other_lock != 0) {
      *self_lock = 0;
    }
    *gp = *gp + 1;
    *self_lock = 0;
  }
  return;
}

Assistant:

void thread_fun_naive(volatile int *self_lock, volatile int *other_lock, int num, int *gp)
{
    // This obviously doesn't work
    auto try_lock = [&] () {
        *self_lock = 1;
        if (*other_lock == 0)
            return true;
        *self_lock = 0;
        return false;
    };
    for (int i = 0;i < num;i++) {
        while (!try_lock())
            pause();
        *gp += 1;
        *self_lock = 0;
    }
}